

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool httplib::detail::read_content_chunked<httplib::Request>
               (Stream *strm,Request *x,ContentReceiverWithProgress *out)

{
  char *pcVar1;
  anon_class_8_1_54a39818 fn;
  bool bVar2;
  char cVar3;
  int iVar4;
  __ssize_t _Var5;
  FILE *__args_3;
  int extraout_var;
  FILE *pFVar6;
  char *pcVar7;
  size_t *__n;
  ulong uVar8;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *extraout_RDX_03;
  size_t *__n_00;
  size_t *__n_01;
  size_t *__n_02;
  _Any_data *__lineptr;
  char **ppcVar9;
  uint64_t r;
  FILE *__args_2;
  stream_line_reader line_reader;
  char *end_ptr;
  char buf [16];
  char buf_1 [4096];
  undefined1 local_10f8 [16];
  size_t local_10e8;
  char *local_10e0;
  _Alloc_hider local_10d8;
  char *local_10d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10c8;
  _Any_data local_10b8;
  code *local_10a8;
  code *pcStack_10a0;
  anon_class_8_1_54a39818 local_1090;
  ContentReceiverWithProgress *local_1088;
  char *local_1080;
  FILE *local_1078;
  undefined1 local_1070 [8];
  function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> local_1068;
  char local_1048 [16];
  _Any_data local_1038 [256];
  unsigned_long __args_1;
  
  local_10d8._M_p = (pointer)&local_10c8;
  local_10f8._8_8_ = local_1048;
  local_10e8 = 0x10;
  local_10e0 = (char *)0x0;
  local_10d0 = (char *)0x0;
  local_10c8._M_local_buf[0] = '\0';
  local_10f8._0_8_ = strm;
  local_1088 = out;
  _Var5 = stream_line_reader::getline
                    ((stream_line_reader *)local_10f8,(char **)x,(size_t *)out,
                     (FILE *)local_10d8._M_p);
  if ((char)_Var5 != '\0') {
    local_1090.x = x;
    while( true ) {
      pFVar6 = (FILE *)&local_10d8;
      if (local_10d0 == (char *)0x0) {
        pFVar6 = (FILE *)(local_10f8 + 8);
      }
      ppcVar9 = &local_1080;
      __args_3 = (FILE *)strtoul(*(char **)pFVar6,ppcVar9,0x10);
      pFVar6 = (FILE *)&local_10d8;
      if (local_10d0 == (char *)0x0) {
        pFVar6 = (FILE *)(local_10f8 + 8);
      }
      if ((local_1080 == *(char **)pFVar6) || (__args_3 == (FILE *)0xffffffffffffffff))
      goto LAB_00155879;
      if (__args_3 == (FILE *)0x0) break;
      local_10a8 = (code *)0x0;
      pcStack_10a0 = (code *)0x0;
      local_10b8._M_unused._M_object = (char *)0x0;
      local_10b8._8_8_ = (char *)0x0;
      std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
                (&local_1068,local_1088);
      __args_2 = (FILE *)0x0;
      do {
        uVar8 = (long)__args_3 - (long)__args_2;
        if (0xfff < uVar8) {
          uVar8 = 0x1000;
        }
        __lineptr = local_1038;
        iVar4 = (*strm->_vptr_Stream[4])(strm,local_1038,uVar8);
        __args_1 = CONCAT44(extraout_var,iVar4);
        __n_00 = extraout_RDX;
        if ((__args_1 == 0 || extraout_var < 0) ||
           (pFVar6 = __args_2, __lineptr = local_1038,
           bVar2 = std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::
                   operator()(&local_1068,local_1038[0]._M_pod_data,__args_1,(unsigned_long)__args_2
                              ,(unsigned_long)__args_3), __n_00 = extraout_RDX_00, !bVar2)) {
LAB_00155771:
          bVar2 = false;
          goto LAB_00155773;
        }
        __args_2 = (FILE *)((long)&__args_2->_flags + __args_1);
        if (local_10a8 != (code *)0x0) {
          __lineptr = (_Any_data *)local_1070;
          local_1078 = __args_3;
          local_1070 = (undefined1  [8])__args_2;
          cVar3 = (*pcStack_10a0)(&local_10b8,__lineptr,&local_1078);
          __n_00 = extraout_RDX_01;
          if (cVar3 == '\0') goto LAB_00155771;
        }
      } while (__args_2 < __args_3);
      bVar2 = true;
LAB_00155773:
      if (local_1068.super__Function_base._M_manager != (_Manager_type)0x0) {
        __lineptr = (_Any_data *)&local_1068;
        (*local_1068.super__Function_base._M_manager)(__lineptr,__lineptr,__destroy_functor);
        __n_00 = extraout_RDX_02;
      }
      if (local_10a8 != (code *)0x0) {
        __lineptr = &local_10b8;
        (*local_10a8)(__lineptr,__lineptr,3);
        __n_00 = extraout_RDX_03;
      }
      if ((!bVar2) ||
         (_Var5 = stream_line_reader::getline
                            ((stream_line_reader *)local_10f8,(char **)__lineptr,__n_00,pFVar6),
         (char)_Var5 == '\0')) goto LAB_00155879;
      pFVar6 = (FILE *)&local_10d8;
      if (local_10d0 == (char *)0x0) {
        pFVar6 = (FILE *)(local_10f8 + 8);
      }
      pcVar1 = *(char **)pFVar6;
      if ((((*pcVar1 != '\r') || (pcVar1[1] != '\n')) || (pcVar1[2] != '\0')) ||
         (_Var5 = stream_line_reader::getline
                            ((stream_line_reader *)local_10f8,(char **)__lineptr,__n_01,
                             (FILE *)(local_10f8 + 8)), (char)_Var5 == '\0')) goto LAB_00155879;
    }
    _Var5 = stream_line_reader::getline((stream_line_reader *)local_10f8,ppcVar9,__n,pFVar6);
    fn.x = local_1090.x;
    if ((char)_Var5 != '\0') {
      bVar2 = false;
      goto LAB_0015581f;
    }
  }
LAB_00155879:
  bVar2 = false;
  goto LAB_0015587b;
  while( true ) {
    pcVar7 = local_10d0;
    if (local_10d0 == (char *)0x0) {
      pcVar7 = local_10e0;
    }
    if ((char *)0x2000 < pcVar7) goto LAB_00155879;
    ppcVar9 = (char **)(pcVar1 + (long)pcVar7 + -2);
    parse_header<httplib::detail::read_content_chunked<httplib::Request>(httplib::Stream&,httplib::Request&,std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
              (pcVar1,(char *)ppcVar9,fn);
    _Var5 = stream_line_reader::getline((stream_line_reader *)local_10f8,ppcVar9,__n_02,pFVar6);
    if ((char)_Var5 == '\0') break;
LAB_0015581f:
    pFVar6 = (FILE *)&local_10d8;
    if (local_10d0 == (char *)0x0) {
      pFVar6 = (FILE *)(local_10f8 + 8);
    }
    pcVar1 = *(char **)pFVar6;
    if (((*pcVar1 == '\r') && (pcVar1[1] == '\n')) && (pcVar1[2] == '\0')) {
      bVar2 = true;
      break;
    }
  }
LAB_0015587b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8._M_p != &local_10c8) {
    operator_delete(local_10d8._M_p,
                    CONCAT71(local_10c8._M_allocated_capacity._1_7_,local_10c8._M_local_buf[0]) + 1)
    ;
  }
  return bVar2;
}

Assistant:

inline bool read_content_chunked(Stream &strm, T &x,
                                 ContentReceiverWithProgress out) {
  const auto bufsiz = 16;
  char buf[bufsiz];

  stream_line_reader line_reader(strm, buf, bufsiz);

  if (!line_reader.getline()) { return false; }

  unsigned long chunk_len;
  while (true) {
    char *end_ptr;

    chunk_len = std::strtoul(line_reader.ptr(), &end_ptr, 16);

    if (end_ptr == line_reader.ptr()) { return false; }
    if (chunk_len == ULONG_MAX) { return false; }

    if (chunk_len == 0) { break; }

    if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
      return false;
    }

    if (!line_reader.getline()) { return false; }

    if (strcmp(line_reader.ptr(), "\r\n")) { return false; }

    if (!line_reader.getline()) { return false; }
  }

  assert(chunk_len == 0);

  // Trailer
  if (!line_reader.getline()) { return false; }

  while (strcmp(line_reader.ptr(), "\r\n")) {
    if (line_reader.size() > CPPHTTPLIB_HEADER_MAX_LENGTH) { return false; }

    // Exclude line terminator
    constexpr auto line_terminator_len = 2;
    auto end = line_reader.ptr() + line_reader.size() - line_terminator_len;

    parse_header(line_reader.ptr(), end,
                 [&](std::string &&key, std::string &&val) {
                   x.headers.emplace(std::move(key), std::move(val));
                 });

    if (!line_reader.getline()) { return false; }
  }

  return true;
}